

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int nifti_hdr_looks_good(nifti_1_header *hdr)

{
  int iVar1;
  uint dtype;
  int iVar2;
  char *__format;
  short *psVar3;
  ulong uVar4;
  
  iVar1 = need_nhdr_swap(hdr->dim[0],hdr->sizeof_hdr);
  iVar2 = 0;
  if (iVar1 < 0) {
    iVar2 = 1;
    if (0 < g_opts_0) {
      fprintf(_stderr,"** bad nhdr fields: dim0, sizeof_hdr = %d, %d\n",
              (ulong)(uint)(int)hdr->dim[0],(ulong)(uint)hdr->sizeof_hdr);
    }
  }
  psVar3 = hdr->dim;
  for (uVar4 = 1; (psVar3 = psVar3 + 1, uVar4 < 8 && ((long)uVar4 <= (long)hdr->dim[0]));
      uVar4 = uVar4 + 1) {
    if (*psVar3 < 1) {
      if (0 < g_opts_0) {
        fprintf(_stderr,"** bad nhdr field: dim[%d] = %d\n",uVar4 & 0xffffffff);
      }
      iVar2 = iVar2 + 1;
    }
  }
  if (((hdr->magic[0] == 'n') && (hdr->magic[3] == '\0')) &&
     (((hdr->magic[1] == 'i' || (hdr->magic[1] == '+')) && ((byte)(hdr->magic[2] - 0x31U) < 9)))) {
    dtype = (uint)hdr->datatype;
    iVar1 = nifti_datatype_is_valid(dtype,1);
    if (iVar1 != 0) goto LAB_0010b173;
    if (0 < g_opts_0) {
      __format = "** bad NIFTI datatype in hdr, %d\n";
      goto LAB_0010b244;
    }
  }
  else {
    if (1 < g_opts_0) {
      fprintf(_stderr,"-- nhdr magic field implies ANALYZE: magic = \'%.4s\'\n",hdr->magic);
    }
    dtype = (uint)hdr->datatype;
    iVar1 = nifti_datatype_is_valid(dtype,0);
    if (iVar1 != 0) goto LAB_0010b173;
    if (0 < g_opts_0) {
      __format = "** bad ANALYZE datatype in hdr, %d\n";
LAB_0010b244:
      fprintf(_stderr,__format,(ulong)dtype);
    }
  }
  iVar2 = iVar2 + 1;
LAB_0010b173:
  iVar1 = 0;
  if (iVar2 == 0) {
    if (2 < g_opts_0) {
      fwrite("-d nifti header looks good\n",0x1b,1,_stderr);
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int nifti_hdr_looks_good(const nifti_1_header * hdr)
{
   int is_nifti, c, errs = 0;

   /* check dim[0] and sizeof_hdr */
   if( need_nhdr_swap(hdr->dim[0], hdr->sizeof_hdr) < 0 ){
      if( g_opts.debug > 0 )
         fprintf(stderr,"** bad nhdr fields: dim0, sizeof_hdr = %d, %d\n",
                 hdr->dim[0], hdr->sizeof_hdr);
      errs++;
   }

   /* check the valid dimension sizes (maybe dim[0] is bad) */
   for( c = 1; c <= hdr->dim[0] && c <= 7; c++ )
      if( hdr->dim[c] <= 0 ){
         if( g_opts.debug > 0 )
            fprintf(stderr,"** bad nhdr field: dim[%d] = %d\n",c,hdr->dim[c]);
         errs++;
      }

   is_nifti = NIFTI_VERSION(*hdr);      /* determine header type */

   if( is_nifti ){      /* NIFTI */

      if( ! nifti_datatype_is_valid(hdr->datatype, 1) ){
         if( g_opts.debug > 0 )
            fprintf(stderr,"** bad NIFTI datatype in hdr, %d\n",hdr->datatype);
         errs++;
      }

   } else {             /* ANALYZE 7.5 */

      if( g_opts.debug > 1 )  /* maybe tell user it's an ANALYZE hdr */
         fprintf(stderr,
            "-- nhdr magic field implies ANALYZE: magic = '%.4s'\n",hdr->magic);

      if( ! nifti_datatype_is_valid(hdr->datatype, 0) ){
         if( g_opts.debug > 0 )
           fprintf(stderr,"** bad ANALYZE datatype in hdr, %d\n",hdr->datatype);
         errs++;
      }
   }

   if( errs ) return 0;  /* problems */

   if( g_opts.debug > 2 ) fprintf(stderr,"-d nifti header looks good\n");

   return 1;   /* looks good */
}